

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O1

bool __thiscall
cmCTest::HandleTestActionArgument
          (cmCTest *this,char *ctestExec,size_t *i,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  ulong uVar1;
  pointer pbVar2;
  bool bVar3;
  size_t sVar4;
  ostream *poVar5;
  size_t sVar6;
  bool bVar7;
  char *in_R8;
  string_view varg1;
  ostringstream cmCTestLog_msg;
  long *local_1c8;
  long local_1b8 [2];
  undefined1 local_1a8 [376];
  
  varg1._M_str = "--test-action";
  varg1._M_len = (size_t)"-T";
  bVar3 = CheckArgument((cmCTest *)
                        ((args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + *i),(string *)&DAT_00000002,
                        varg1,in_R8);
  bVar7 = true;
  if (bVar3) {
    uVar1 = *i;
    pbVar2 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (uVar1 < ((long)(args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) - 1U) {
      ((this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->ProduceXML = true;
      sVar4 = uVar1 + 1;
      *i = sVar4;
      bVar3 = SetTest(this,pbVar2 + sVar4,false);
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"CTest -T called with incorrect option: ",0x27);
        pbVar2 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,pbVar2[*i]._M_dataplus._M_p,
                            pbVar2[*i]._M_string_length);
        std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        Log(this,7,
            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
            ,0xaff,(char *)local_1c8,false);
        if (local_1c8 != local_1b8) {
          operator_delete(local_1c8,local_1b8[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Available options are:",0x16);
        std::ios::widen((char)(ostringstream *)local_1a8 +
                        (char)*(_func_int **)(local_1a8._0_8_ + -0x18));
        std::ostream::put((char)local_1a8);
        poVar5 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
        if (ctestExec == (char *)0x0) {
          std::ios::clear((int)poVar5 + (int)poVar5->_vptr_basic_ostream[-3]);
        }
        else {
          sVar6 = strlen(ctestExec);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,ctestExec,sVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," -T all",7);
        std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
        std::ostream::put((char)poVar5);
        poVar5 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
        if (ctestExec == (char *)0x0) {
          std::ios::clear((int)poVar5 + (int)poVar5->_vptr_basic_ostream[-3]);
        }
        else {
          sVar6 = strlen(ctestExec);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,ctestExec,sVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," -T start",9);
        std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
        std::ostream::put((char)poVar5);
        poVar5 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
        if (ctestExec == (char *)0x0) {
          std::ios::clear((int)poVar5 + (int)poVar5->_vptr_basic_ostream[-3]);
        }
        else {
          sVar6 = strlen(ctestExec);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,ctestExec,sVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," -T update",10);
        std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
        std::ostream::put((char)poVar5);
        poVar5 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
        if (ctestExec == (char *)0x0) {
          std::ios::clear((int)poVar5 + (int)poVar5->_vptr_basic_ostream[-3]);
        }
        else {
          sVar6 = strlen(ctestExec);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,ctestExec,sVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," -T configure",0xd);
        std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
        std::ostream::put((char)poVar5);
        poVar5 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
        if (ctestExec == (char *)0x0) {
          std::ios::clear((int)poVar5 + (int)poVar5->_vptr_basic_ostream[-3]);
        }
        else {
          sVar6 = strlen(ctestExec);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,ctestExec,sVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," -T build",9);
        std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
        std::ostream::put((char)poVar5);
        poVar5 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
        if (ctestExec == (char *)0x0) {
          std::ios::clear((int)poVar5 + (int)poVar5->_vptr_basic_ostream[-3]);
        }
        else {
          sVar6 = strlen(ctestExec);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,ctestExec,sVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," -T test",8);
        std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
        std::ostream::put((char)poVar5);
        poVar5 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
        if (ctestExec == (char *)0x0) {
          std::ios::clear((int)poVar5 + (int)poVar5->_vptr_basic_ostream[-3]);
        }
        else {
          sVar6 = strlen(ctestExec);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,ctestExec,sVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," -T coverage",0xc);
        std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
        std::ostream::put((char)poVar5);
        poVar5 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
        if (ctestExec == (char *)0x0) {
          std::ios::clear((int)poVar5 + (int)poVar5->_vptr_basic_ostream[-3]);
        }
        else {
          sVar6 = strlen(ctestExec);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,ctestExec,sVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," -T memcheck",0xc);
        std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
        std::ostream::put((char)poVar5);
        poVar5 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
        if (ctestExec == (char *)0x0) {
          std::ios::clear((int)poVar5 + (int)poVar5->_vptr_basic_ostream[-3]);
        }
        else {
          sVar6 = strlen(ctestExec);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,ctestExec,sVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," -T notes",9);
        std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
        std::ostream::put((char)poVar5);
        poVar5 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
        if (ctestExec == (char *)0x0) {
          std::ios::clear((int)poVar5 + (int)poVar5->_vptr_basic_ostream[-3]);
        }
        else {
          sVar6 = strlen(ctestExec);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,ctestExec,sVar6);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," -T submit",10);
        std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        Log(this,7,
            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
            ,0xb0c,(char *)local_1c8,false);
        if (local_1c8 != local_1b8) {
          operator_delete(local_1c8,local_1b8[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
        bVar7 = false;
      }
    }
  }
  return bVar7;
}

Assistant:

bool cmCTest::HandleTestActionArgument(const char* ctestExec, size_t& i,
                                       const std::vector<std::string>& args)
{
  bool success = true;
  std::string const& arg = args[i];
  if (this->CheckArgument(arg, "-T"_s, "--test-action") &&
      (i < args.size() - 1)) {
    this->Impl->ProduceXML = true;
    i++;
    if (!this->SetTest(args[i], false)) {
      success = false;
      cmCTestLog(this, ERROR_MESSAGE,
                 "CTest -T called with incorrect option: " << args[i]
                                                           << std::endl);
      cmCTestLog(this, ERROR_MESSAGE,
                 "Available options are:"
                   << std::endl
                   << "  " << ctestExec << " -T all" << std::endl
                   << "  " << ctestExec << " -T start" << std::endl
                   << "  " << ctestExec << " -T update" << std::endl
                   << "  " << ctestExec << " -T configure" << std::endl
                   << "  " << ctestExec << " -T build" << std::endl
                   << "  " << ctestExec << " -T test" << std::endl
                   << "  " << ctestExec << " -T coverage" << std::endl
                   << "  " << ctestExec << " -T memcheck" << std::endl
                   << "  " << ctestExec << " -T notes" << std::endl
                   << "  " << ctestExec << " -T submit" << std::endl);
    }
  }
  return success;
}